

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O0

int load_real_openal(void)

{
  char *pcVar1;
  FILE *pFVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  char *fullpath;
  size_t fulllen;
  char *cwd;
  char *dllname;
  int local_10;
  int okay;
  int extensions;
  
  local_10 = 0;
  dllname._4_4_ = 1;
  realdll = (void *)dlopen("libopenal.so.1",2);
  pFVar2 = _stderr;
  pcVar4 = GAppName;
  if (realdll == (void *)0x0) {
    uVar3 = dlerror();
    fprintf(pFVar2,"%s: Failed to load %s: %s\n",pcVar4,"libopenal.so.1",uVar3);
    fflush(_stderr);
  }
  if ((realdll == (void *)0x0) && (pcVar4 = getcwd((char *)0x0,0), pcVar4 != (char *)0x0)) {
    sVar5 = strlen(pcVar4);
    sVar6 = strlen("libopenal.so.1");
    sVar5 = sVar5 + sVar6 + 2;
    __s = (char *)malloc(sVar5);
    if (__s != (char *)0x0) {
      snprintf(__s,sVar5,"%s/%s",pcVar4,"libopenal.so.1");
      realdll = (void *)dlopen("libopenal.so.1",2);
      pFVar2 = _stderr;
      pcVar1 = GAppName;
      if (realdll == (void *)0x0) {
        uVar3 = dlerror();
        fprintf(pFVar2,"%s: Failed to load %s: %s\n",pcVar1,__s,uVar3);
        fflush(_stderr);
      }
      free(__s);
    }
    free(pcVar4);
  }
  if (realdll == (void *)0x0) {
    fprintf(_stderr,"%s: Couldn\'t load OpenAL from anywhere obvious. Giving up.\n",GAppName);
    fflush(_stderr);
    okay = 0;
  }
  else {
    REAL_alcGetCurrentContext =
         (_func_ALCcontext_ptr *)
         loadEntryPoint(realdll,"alcGetCurrentContext",local_10,(int *)((long)&dllname + 4));
    REAL_alcGetContextsDevice =
         (_func_ALCdevice_ptr_ALCcontext_ptr *)
         loadEntryPoint(realdll,"alcGetContextsDevice",local_10,(int *)((long)&dllname + 4));
    REAL_alcIsExtensionPresent =
         (_func_ALCboolean_ALCdevice_ptr_ALCchar_ptr *)
         loadEntryPoint(realdll,"alcIsExtensionPresent",local_10,(int *)((long)&dllname + 4));
    REAL_alcGetProcAddress =
         (_func_void_ptr_ALCdevice_ptr_ALCchar_ptr *)
         loadEntryPoint(realdll,"alcGetProcAddress",local_10,(int *)((long)&dllname + 4));
    REAL_alcGetEnumValue =
         (_func_ALCenum_ALCdevice_ptr_ALCchar_ptr *)
         loadEntryPoint(realdll,"alcGetEnumValue",local_10,(int *)((long)&dllname + 4));
    REAL_alcGetString =
         (_func_ALCchar_ptr_ALCdevice_ptr_ALCenum *)
         loadEntryPoint(realdll,"alcGetString",local_10,(int *)((long)&dllname + 4));
    REAL_alcCaptureOpenDevice =
         (_func_ALCdevice_ptr_ALCchar_ptr_ALCuint_ALCenum_ALCsizei *)
         loadEntryPoint(realdll,"alcCaptureOpenDevice",local_10,(int *)((long)&dllname + 4));
    REAL_alcCaptureCloseDevice =
         (_func_ALCboolean_ALCdevice_ptr *)
         loadEntryPoint(realdll,"alcCaptureCloseDevice",local_10,(int *)((long)&dllname + 4));
    REAL_alcOpenDevice =
         (_func_ALCdevice_ptr_ALCchar_ptr *)
         loadEntryPoint(realdll,"alcOpenDevice",local_10,(int *)((long)&dllname + 4));
    REAL_alcCloseDevice =
         (_func_ALCboolean_ALCdevice_ptr *)
         loadEntryPoint(realdll,"alcCloseDevice",local_10,(int *)((long)&dllname + 4));
    REAL_alcCreateContext =
         (_func_ALCcontext_ptr_ALCdevice_ptr_ALCint_ptr *)
         loadEntryPoint(realdll,"alcCreateContext",local_10,(int *)((long)&dllname + 4));
    REAL_alcMakeContextCurrent =
         (_func_ALCboolean_ALCcontext_ptr *)
         loadEntryPoint(realdll,"alcMakeContextCurrent",local_10,(int *)((long)&dllname + 4));
    REAL_alcProcessContext =
         (_func_void_ALCcontext_ptr *)
         loadEntryPoint(realdll,"alcProcessContext",local_10,(int *)((long)&dllname + 4));
    REAL_alcSuspendContext =
         (_func_void_ALCcontext_ptr *)
         loadEntryPoint(realdll,"alcSuspendContext",local_10,(int *)((long)&dllname + 4));
    REAL_alcDestroyContext =
         (_func_void_ALCcontext_ptr *)
         loadEntryPoint(realdll,"alcDestroyContext",local_10,(int *)((long)&dllname + 4));
    REAL_alcGetError =
         (_func_ALCenum_ALCdevice_ptr *)
         loadEntryPoint(realdll,"alcGetError",local_10,(int *)((long)&dllname + 4));
    REAL_alcGetIntegerv =
         (_func_void_ALCdevice_ptr_ALCenum_ALCsizei_ALCint_ptr *)
         loadEntryPoint(realdll,"alcGetIntegerv",local_10,(int *)((long)&dllname + 4));
    REAL_alcCaptureStart =
         (_func_void_ALCdevice_ptr *)
         loadEntryPoint(realdll,"alcCaptureStart",local_10,(int *)((long)&dllname + 4));
    REAL_alcCaptureStop =
         (_func_void_ALCdevice_ptr *)
         loadEntryPoint(realdll,"alcCaptureStop",local_10,(int *)((long)&dllname + 4));
    REAL_alcCaptureSamples =
         (_func_void_ALCdevice_ptr_ALCvoid_ptr_ALCsizei *)
         loadEntryPoint(realdll,"alcCaptureSamples",local_10,(int *)((long)&dllname + 4));
    REAL_alDopplerFactor =
         (_func_void_ALfloat *)
         loadEntryPoint(realdll,"alDopplerFactor",local_10,(int *)((long)&dllname + 4));
    REAL_alDopplerVelocity =
         (_func_void_ALfloat *)
         loadEntryPoint(realdll,"alDopplerVelocity",local_10,(int *)((long)&dllname + 4));
    REAL_alSpeedOfSound =
         (_func_void_ALfloat *)
         loadEntryPoint(realdll,"alSpeedOfSound",local_10,(int *)((long)&dllname + 4));
    REAL_alDistanceModel =
         (_func_void_ALenum *)
         loadEntryPoint(realdll,"alDistanceModel",local_10,(int *)((long)&dllname + 4));
    REAL_alEnable =
         (_func_void_ALenum *)
         loadEntryPoint(realdll,"alEnable",local_10,(int *)((long)&dllname + 4));
    REAL_alDisable =
         (_func_void_ALenum *)
         loadEntryPoint(realdll,"alDisable",local_10,(int *)((long)&dllname + 4));
    REAL_alIsEnabled =
         (_func_ALboolean_ALenum *)
         loadEntryPoint(realdll,"alIsEnabled",local_10,(int *)((long)&dllname + 4));
    REAL_alGetString =
         (_func_ALchar_ptr_ALenum *)
         loadEntryPoint(realdll,"alGetString",local_10,(int *)((long)&dllname + 4));
    REAL_alGetBooleanv =
         (_func_void_ALenum_ALboolean_ptr *)
         loadEntryPoint(realdll,"alGetBooleanv",local_10,(int *)((long)&dllname + 4));
    REAL_alGetIntegerv =
         (_func_void_ALenum_ALint_ptr *)
         loadEntryPoint(realdll,"alGetIntegerv",local_10,(int *)((long)&dllname + 4));
    REAL_alGetFloatv =
         (_func_void_ALenum_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetFloatv",local_10,(int *)((long)&dllname + 4));
    REAL_alGetDoublev =
         (_func_void_ALenum_ALdouble_ptr *)
         loadEntryPoint(realdll,"alGetDoublev",local_10,(int *)((long)&dllname + 4));
    REAL_alGetBoolean =
         (_func_ALboolean_ALenum *)
         loadEntryPoint(realdll,"alGetBoolean",local_10,(int *)((long)&dllname + 4));
    REAL_alGetInteger =
         (_func_ALint_ALenum *)
         loadEntryPoint(realdll,"alGetInteger",local_10,(int *)((long)&dllname + 4));
    REAL_alGetFloat =
         (_func_ALfloat_ALenum *)
         loadEntryPoint(realdll,"alGetFloat",local_10,(int *)((long)&dllname + 4));
    REAL_alGetDouble =
         (_func_ALdouble_ALenum *)
         loadEntryPoint(realdll,"alGetDouble",local_10,(int *)((long)&dllname + 4));
    REAL_alIsExtensionPresent =
         (_func_ALboolean_ALchar_ptr *)
         loadEntryPoint(realdll,"alIsExtensionPresent",local_10,(int *)((long)&dllname + 4));
    REAL_alGetError =
         (_func_ALenum *)loadEntryPoint(realdll,"alGetError",local_10,(int *)((long)&dllname + 4));
    REAL_alGetProcAddress =
         (_func_void_ptr_ALchar_ptr *)
         loadEntryPoint(realdll,"alGetProcAddress",local_10,(int *)((long)&dllname + 4));
    REAL_alGetEnumValue =
         (_func_ALenum_ALchar_ptr *)
         loadEntryPoint(realdll,"alGetEnumValue",local_10,(int *)((long)&dllname + 4));
    REAL_alListenerfv =
         (_func_void_ALenum_ALfloat_ptr *)
         loadEntryPoint(realdll,"alListenerfv",local_10,(int *)((long)&dllname + 4));
    REAL_alListenerf =
         (_func_void_ALenum_ALfloat *)
         loadEntryPoint(realdll,"alListenerf",local_10,(int *)((long)&dllname + 4));
    REAL_alListener3f =
         (_func_void_ALenum_ALfloat_ALfloat_ALfloat *)
         loadEntryPoint(realdll,"alListener3f",local_10,(int *)((long)&dllname + 4));
    REAL_alListeneriv =
         (_func_void_ALenum_ALint_ptr *)
         loadEntryPoint(realdll,"alListeneriv",local_10,(int *)((long)&dllname + 4));
    REAL_alListeneri =
         (_func_void_ALenum_ALint *)
         loadEntryPoint(realdll,"alListeneri",local_10,(int *)((long)&dllname + 4));
    REAL_alListener3i =
         (_func_void_ALenum_ALint_ALint_ALint *)
         loadEntryPoint(realdll,"alListener3i",local_10,(int *)((long)&dllname + 4));
    REAL_alGetListenerfv =
         (_func_void_ALenum_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetListenerfv",local_10,(int *)((long)&dllname + 4));
    REAL_alGetListenerf =
         (_func_void_ALenum_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetListenerf",local_10,(int *)((long)&dllname + 4));
    REAL_alGetListener3f =
         (_func_void_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetListener3f",local_10,(int *)((long)&dllname + 4));
    REAL_alGetListeneri =
         (_func_void_ALenum_ALint_ptr *)
         loadEntryPoint(realdll,"alGetListeneri",local_10,(int *)((long)&dllname + 4));
    REAL_alGetListeneriv =
         (_func_void_ALenum_ALint_ptr *)
         loadEntryPoint(realdll,"alGetListeneriv",local_10,(int *)((long)&dllname + 4));
    REAL_alGetListener3i =
         (_func_void_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)
         loadEntryPoint(realdll,"alGetListener3i",local_10,(int *)((long)&dllname + 4));
    REAL_alGenSources =
         (_func_void_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alGenSources",local_10,(int *)((long)&dllname + 4));
    REAL_alDeleteSources =
         (_func_void_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alDeleteSources",local_10,(int *)((long)&dllname + 4));
    REAL_alIsSource =
         (_func_ALboolean_ALuint *)
         loadEntryPoint(realdll,"alIsSource",local_10,(int *)((long)&dllname + 4));
    REAL_alSourcefv =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)
         loadEntryPoint(realdll,"alSourcefv",local_10,(int *)((long)&dllname + 4));
    REAL_alSourcef =
         (_func_void_ALuint_ALenum_ALfloat *)
         loadEntryPoint(realdll,"alSourcef",local_10,(int *)((long)&dllname + 4));
    REAL_alSource3f =
         (_func_void_ALuint_ALenum_ALfloat_ALfloat_ALfloat *)
         loadEntryPoint(realdll,"alSource3f",local_10,(int *)((long)&dllname + 4));
    REAL_alSourceiv =
         (_func_void_ALuint_ALenum_ALint_ptr *)
         loadEntryPoint(realdll,"alSourceiv",local_10,(int *)((long)&dllname + 4));
    REAL_alSourcei =
         (_func_void_ALuint_ALenum_ALint *)
         loadEntryPoint(realdll,"alSourcei",local_10,(int *)((long)&dllname + 4));
    REAL_alSource3i =
         (_func_void_ALuint_ALenum_ALint_ALint_ALint *)
         loadEntryPoint(realdll,"alSource3i",local_10,(int *)((long)&dllname + 4));
    REAL_alGetSourcefv =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetSourcefv",local_10,(int *)((long)&dllname + 4));
    REAL_alGetSourcef =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetSourcef",local_10,(int *)((long)&dllname + 4));
    REAL_alGetSource3f =
         (_func_void_ALuint_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetSource3f",local_10,(int *)((long)&dllname + 4));
    REAL_alGetSourceiv =
         (_func_void_ALuint_ALenum_ALint_ptr *)
         loadEntryPoint(realdll,"alGetSourceiv",local_10,(int *)((long)&dllname + 4));
    REAL_alGetSourcei =
         (_func_void_ALuint_ALenum_ALint_ptr *)
         loadEntryPoint(realdll,"alGetSourcei",local_10,(int *)((long)&dllname + 4));
    REAL_alGetSource3i =
         (_func_void_ALuint_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)
         loadEntryPoint(realdll,"alGetSource3i",local_10,(int *)((long)&dllname + 4));
    REAL_alSourcePlay =
         (_func_void_ALuint *)
         loadEntryPoint(realdll,"alSourcePlay",local_10,(int *)((long)&dllname + 4));
    REAL_alSourcePlayv =
         (_func_void_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alSourcePlayv",local_10,(int *)((long)&dllname + 4));
    REAL_alSourcePause =
         (_func_void_ALuint *)
         loadEntryPoint(realdll,"alSourcePause",local_10,(int *)((long)&dllname + 4));
    REAL_alSourcePausev =
         (_func_void_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alSourcePausev",local_10,(int *)((long)&dllname + 4));
    REAL_alSourceRewind =
         (_func_void_ALuint *)
         loadEntryPoint(realdll,"alSourceRewind",local_10,(int *)((long)&dllname + 4));
    REAL_alSourceRewindv =
         (_func_void_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alSourceRewindv",local_10,(int *)((long)&dllname + 4));
    REAL_alSourceStop =
         (_func_void_ALuint *)
         loadEntryPoint(realdll,"alSourceStop",local_10,(int *)((long)&dllname + 4));
    REAL_alSourceStopv =
         (_func_void_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alSourceStopv",local_10,(int *)((long)&dllname + 4));
    REAL_alSourceQueueBuffers =
         (_func_void_ALuint_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alSourceQueueBuffers",local_10,(int *)((long)&dllname + 4));
    REAL_alSourceUnqueueBuffers =
         (_func_void_ALuint_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alSourceUnqueueBuffers",local_10,(int *)((long)&dllname + 4));
    REAL_alGenBuffers =
         (_func_void_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alGenBuffers",local_10,(int *)((long)&dllname + 4));
    REAL_alDeleteBuffers =
         (_func_void_ALsizei_ALuint_ptr *)
         loadEntryPoint(realdll,"alDeleteBuffers",local_10,(int *)((long)&dllname + 4));
    REAL_alIsBuffer =
         (_func_ALboolean_ALuint *)
         loadEntryPoint(realdll,"alIsBuffer",local_10,(int *)((long)&dllname + 4));
    REAL_alBufferData =
         (_func_void_ALuint_ALenum_ALvoid_ptr_ALsizei_ALsizei *)
         loadEntryPoint(realdll,"alBufferData",local_10,(int *)((long)&dllname + 4));
    REAL_alBufferfv =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)
         loadEntryPoint(realdll,"alBufferfv",local_10,(int *)((long)&dllname + 4));
    REAL_alBufferf =
         (_func_void_ALuint_ALenum_ALfloat *)
         loadEntryPoint(realdll,"alBufferf",local_10,(int *)((long)&dllname + 4));
    REAL_alBuffer3f =
         (_func_void_ALuint_ALenum_ALfloat_ALfloat_ALfloat *)
         loadEntryPoint(realdll,"alBuffer3f",local_10,(int *)((long)&dllname + 4));
    REAL_alBufferiv =
         (_func_void_ALuint_ALenum_ALint_ptr *)
         loadEntryPoint(realdll,"alBufferiv",local_10,(int *)((long)&dllname + 4));
    REAL_alBufferi =
         (_func_void_ALuint_ALenum_ALint *)
         loadEntryPoint(realdll,"alBufferi",local_10,(int *)((long)&dllname + 4));
    REAL_alBuffer3i =
         (_func_void_ALuint_ALenum_ALint_ALint_ALint *)
         loadEntryPoint(realdll,"alBuffer3i",local_10,(int *)((long)&dllname + 4));
    REAL_alGetBufferfv =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetBufferfv",local_10,(int *)((long)&dllname + 4));
    REAL_alGetBufferf =
         (_func_void_ALuint_ALenum_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetBufferf",local_10,(int *)((long)&dllname + 4));
    REAL_alGetBuffer3f =
         (_func_void_ALuint_ALenum_ALfloat_ptr_ALfloat_ptr_ALfloat_ptr *)
         loadEntryPoint(realdll,"alGetBuffer3f",local_10,(int *)((long)&dllname + 4));
    REAL_alGetBufferi =
         (_func_void_ALuint_ALenum_ALint_ptr *)
         loadEntryPoint(realdll,"alGetBufferi",local_10,(int *)((long)&dllname + 4));
    REAL_alGetBuffer3i =
         (_func_void_ALuint_ALenum_ALint_ptr_ALint_ptr_ALint_ptr *)
         loadEntryPoint(realdll,"alGetBuffer3i",local_10,(int *)((long)&dllname + 4));
    REAL_alGetBufferiv =
         (_func_void_ALuint_ALenum_ALint_ptr *)
         loadEntryPoint(realdll,"alGetBufferiv",local_10,(int *)((long)&dllname + 4));
    local_10 = 1;
    REAL_alTracePushScope =
         (_func_void_ALchar_ptr *)
         loadEntryPoint(realdll,"alTracePushScope",1,(int *)((long)&dllname + 4));
    REAL_alTracePopScope =
         (_func_void *)
         loadEntryPoint(realdll,"alTracePopScope",local_10,(int *)((long)&dllname + 4));
    REAL_alTraceMessage =
         (_func_void_ALchar_ptr *)
         loadEntryPoint(realdll,"alTraceMessage",local_10,(int *)((long)&dllname + 4));
    REAL_alTraceBufferLabel =
         (_func_void_ALuint_ALchar_ptr *)
         loadEntryPoint(realdll,"alTraceBufferLabel",local_10,(int *)((long)&dllname + 4));
    REAL_alTraceSourceLabel =
         (_func_void_ALuint_ALchar_ptr *)
         loadEntryPoint(realdll,"alTraceSourceLabel",local_10,(int *)((long)&dllname + 4));
    REAL_alcTraceDeviceLabel =
         (_func_void_ALCdevice_ptr_ALchar_ptr *)
         loadEntryPoint(realdll,"alcTraceDeviceLabel",local_10,(int *)((long)&dllname + 4));
    REAL_alcTraceContextLabel =
         (_func_void_ALCcontext_ptr_ALchar_ptr *)
         loadEntryPoint(realdll,"alcTraceContextLabel",local_10,(int *)((long)&dllname + 4));
    okay = dllname._4_4_;
  }
  return okay;
}

Assistant:

int load_real_openal(void)
{
    int extensions = 0;
    int okay = 1;
    #ifdef __APPLE__
    const char *dllname = "libopenal.1.dylib";
    #elif defined(_WIN32)
    const char *dllname = "openal32.dll";
    #else
    const char *dllname = "libopenal.so.1";
    #endif

    realdll = dlopen(dllname, RTLD_NOW | RTLD_LOCAL);
    if (!realdll) {
        fprintf(stderr, "%s: Failed to load %s: %s\n", GAppName, dllname, dlerror());
        fflush(stderr);
    }

    if (!realdll) {
        // Not in the libpath? See if we can find it in the cwd.
        char *cwd = getcwd(NULL, 0);
        if (cwd) {
            const size_t fulllen = strlen(cwd) + strlen(dllname) + 2;
            char *fullpath = (char *) malloc(fulllen);
            if (fullpath) {
                snprintf(fullpath, fulllen, "%s/%s", cwd, dllname);
                realdll = dlopen(dllname, RTLD_NOW | RTLD_LOCAL);
                if (!realdll) {
                    fprintf(stderr, "%s: Failed to load %s: %s\n", GAppName, fullpath, dlerror());
                    fflush(stderr);
                }
                free(fullpath);
            }
            free(cwd);
        }
    }

    if (!realdll) {
        fprintf(stderr, "%s: Couldn't load OpenAL from anywhere obvious. Giving up.\n", GAppName);
        fflush(stderr);
        return 0;
    }

    #define ENTRYPOINT_EXTENSIONS_BEGIN() extensions = 1;
    #define ENTRYPOINT(ret,name,params,args,numargs,visitparams,visitargs) REAL_##name = (ret (*)params) loadEntryPoint(realdll, #name, extensions, &okay);
    #include "altrace_entrypoints.h"
    return okay;
}